

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EncodeOrDecode
          (CommandLineInterface *this,DescriptorPool *pool)

{
  bool bVar1;
  int iVar2;
  Descriptor *type;
  Message *pMVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  MessageLite *pMVar5;
  bool bVar6;
  char *pcVar7;
  scoped_ptr<google::protobuf::Message> message;
  ErrorPrinter error_collector;
  Parser parser;
  DynamicMessageFactory dynamic_factory;
  FileOutputStream out;
  FileInputStream in;
  
  type = DescriptorPool::FindMessageTypeByName(pool,&this->codec_type_);
  if (type == (Descriptor *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Type not defined: ");
    poVar4 = std::operator<<(poVar4,(string *)&this->codec_type_);
    std::endl<char,std::char_traits<char>>(poVar4);
    return false;
  }
  DynamicMessageFactory::DynamicMessageFactory(&dynamic_factory,pool);
  pMVar3 = DynamicMessageFactory::GetPrototype(&dynamic_factory,type);
  iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3);
  message.ptr_ = (Message *)CONCAT44(extraout_var,iVar2);
  io::FileInputStream::FileInputStream(&in,0,-1);
  io::FileOutputStream::FileOutputStream(&out,1,-1);
  if (this->mode_ == MODE_ENCODE) {
    error_collector.format_ = this->error_format_;
    error_collector.super_MultiFileErrorCollector._vptr_MultiFileErrorCollector =
         (_func_int **)&PTR__ErrorPrinter_00295db0;
    error_collector.super_ErrorCollector._vptr_ErrorCollector =
         (_func_int **)&PTR__ErrorPrinter_00295de0;
    error_collector.tree_ = (DiskSourceTree *)0x0;
    TextFormat::Parser::Parser(&parser);
    parser.error_collector_ = &error_collector.super_ErrorCollector;
    parser.allow_partial_ = true;
    bVar1 = TextFormat::Parser::Parse(&parser,&in.super_ZeroCopyInputStream,message.ptr_);
    if (bVar1) {
      TextFormat::Parser::~Parser(&parser);
      ErrorPrinter::~ErrorPrinter(&error_collector);
LAB_001a3cc8:
      pMVar3 = internal::scoped_ptr<google::protobuf::Message>::operator->(&message);
      iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[5])(pMVar3);
      if ((char)iVar2 == '\0') {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "warning:  Input message is missing required fields:  ");
        pMVar3 = internal::scoped_ptr<google::protobuf::Message>::operator->(&message);
        (*(pMVar3->super_MessageLite)._vptr_MessageLite[6])(&error_collector,pMVar3);
        poVar4 = std::operator<<(poVar4,(string *)&error_collector);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&error_collector);
      }
      if (this->mode_ == MODE_ENCODE) {
        pMVar5 = &internal::scoped_ptr<google::protobuf::Message>::operator->(&message)->
                  super_MessageLite;
        bVar1 = MessageLite::SerializePartialToZeroCopyStream
                          (pMVar5,&out.super_ZeroCopyOutputStream);
      }
      else {
        pMVar3 = internal::scoped_ptr<google::protobuf::Message>::operator*(&message);
        bVar1 = TextFormat::Print(pMVar3,&out.super_ZeroCopyOutputStream);
      }
      bVar6 = true;
      if (bVar1 != false) goto LAB_001a3dba;
      pcVar7 = "output: I/O error.";
      goto LAB_001a3da4;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to parse input.");
    std::endl<char,std::char_traits<char>>(poVar4);
    TextFormat::Parser::~Parser(&parser);
    ErrorPrinter::~ErrorPrinter(&error_collector);
  }
  else {
    pMVar5 = &internal::scoped_ptr<google::protobuf::Message>::operator->(&message)->
              super_MessageLite;
    bVar1 = MessageLite::ParsePartialFromZeroCopyStream(pMVar5,&in.super_ZeroCopyInputStream);
    if (bVar1) goto LAB_001a3cc8;
    pcVar7 = "Failed to parse input.";
LAB_001a3da4:
    poVar4 = std::operator<<((ostream *)&std::cerr,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  bVar6 = false;
LAB_001a3dba:
  io::FileOutputStream::~FileOutputStream(&out);
  io::FileInputStream::~FileInputStream(&in);
  if (message.ptr_ != (Message *)0x0) {
    (*((message.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  DynamicMessageFactory::~DynamicMessageFactory(&dynamic_factory);
  return bVar6;
}

Assistant:

bool CommandLineInterface::EncodeOrDecode(const DescriptorPool* pool) {
  // Look up the type.
  const Descriptor* type = pool->FindMessageTypeByName(codec_type_);
  if (type == NULL) {
    cerr << "Type not defined: " << codec_type_ << endl;
    return false;
  }

  DynamicMessageFactory dynamic_factory(pool);
  scoped_ptr<Message> message(dynamic_factory.GetPrototype(type)->New());

  if (mode_ == MODE_ENCODE) {
    SetFdToTextMode(STDIN_FILENO);
    SetFdToBinaryMode(STDOUT_FILENO);
  } else {
    SetFdToBinaryMode(STDIN_FILENO);
    SetFdToTextMode(STDOUT_FILENO);
  }

  io::FileInputStream in(STDIN_FILENO);
  io::FileOutputStream out(STDOUT_FILENO);

  if (mode_ == MODE_ENCODE) {
    // Input is text.
    ErrorPrinter error_collector(error_format_);
    TextFormat::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    parser.AllowPartialMessage(true);

    if (!parser.Parse(&in, message.get())) {
      cerr << "Failed to parse input." << endl;
      return false;
    }
  } else {
    // Input is binary.
    if (!message->ParsePartialFromZeroCopyStream(&in)) {
      cerr << "Failed to parse input." << endl;
      return false;
    }
  }

  if (!message->IsInitialized()) {
    cerr << "warning:  Input message is missing required fields:  "
         << message->InitializationErrorString() << endl;
  }

  if (mode_ == MODE_ENCODE) {
    // Output is binary.
    if (!message->SerializePartialToZeroCopyStream(&out)) {
      cerr << "output: I/O error." << endl;
      return false;
    }
  } else {
    // Output is text.
    if (!TextFormat::Print(*message, &out)) {
      cerr << "output: I/O error." << endl;
      return false;
    }
  }

  return true;
}